

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout_and_stderr_to_file2(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint file;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar6;
  uv_loop_t *puVar7;
  uv_process_options_t *puVar8;
  int extraout_EDX;
  char *pcVar9;
  char *loop;
  uv__queue *unaff_RBP;
  int iVar10;
  undefined1 *puVar11;
  uv_handle_t *puVar12;
  uv_process_options_t *unaff_R14;
  uv__queue *unaff_R15;
  int64_t eval_b_2;
  int64_t eval_b_6;
  int64_t eval_b;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  undefined1 auStackY_ac8 [48];
  uv_loop_t *puStackY_a98;
  long lStackY_a88;
  long lStackY_a80;
  uv_loop_t *puStackY_a78;
  uv_process_options_t *puStackY_a70;
  long lStackY_a60;
  long lStackY_a58;
  uv_os_fd_t uStackY_a4c;
  uv_stdio_container_t uStackY_a48;
  undefined4 uStackY_a38;
  undefined4 uStackY_a30;
  undefined4 uStackY_a28;
  undefined4 uStackY_a20;
  undefined4 uStackY_a18;
  uv_os_fd_t uStackY_a10;
  sockaddr_in sStackY_a08;
  uv_loop_t *puStackY_9f8;
  undefined8 uStackY_9f0;
  long lStackY_9e8;
  uv_tcp_t uStackY_9e0;
  long lStackY_908;
  long lStackY_900;
  uv_stdio_container_t uStackY_8f8;
  undefined4 uStackY_8e8;
  undefined4 uStackY_8d8;
  undefined4 uStackY_8c8;
  uv_loop_t *puStackY_8c0;
  undefined1 auStackY_8b0 [296];
  undefined1 auStackY_788 [16];
  char acStackY_778 [32];
  uv_stdio_container_t uStackY_758;
  undefined4 uStackY_748;
  uv_loop_t *puStackY_740;
  uv_write_t uStackY_730;
  uv_stream_t uStackY_668;
  uv_stream_t uStackY_580;
  uv_loop_t *puStackY_498;
  uv_fs_t *puStackY_490;
  uv__queue *puStackY_488;
  uv_buf_t uStack_460;
  uv_rwlock_t uStack_450;
  uv_fs_t uStack_418;
  uv_loop_t *puStack_258;
  uv_fs_t *puStack_250;
  uv_buf_t local_218;
  uv_stdio_container_t local_208;
  undefined4 local_1f8;
  uint local_1f0;
  undefined4 local_1e8;
  uint local_1e0;
  uv_fs_t local_1d8;
  
  uStack_460.len = (size_t)uStack_460.base;
  local_218.len = (size_t)local_218.base;
  pcVar9 = "stdout_file";
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&local_1d8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  local_208._0_8_ = SEXT48(iVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_218.len;
  local_218 = (uv_buf_t)(auVar2 << 0x40);
  if (local_208._0_8_ == 0) {
    uv_fs_req_cleanup(&local_1d8);
    unaff_RBP = (uv__queue *)0x2;
    uVar5 = dup2((int)local_1d8.result,2);
    pcVar9 = (char *)(ulong)uVar5;
    local_208._0_8_ = SEXT48((int)uVar5);
    local_218.base = (char *)0xffffffffffffffff;
    if (local_208._0_8_ == -1) goto LAB_001bc184;
    options.stdio = &local_208;
    unaff_R14 = &options;
    local_208._4_4_ = (int)uVar5 >> 0x1f;
    local_208._0_8_ = (ulong)(uint)local_208._4_4_ << 0x20;
    local_1f8 = 2;
    local_1e8 = 2;
    options.stdio_count = 3;
    local_1f0 = uVar5;
    local_1e0 = uVar5;
    puVar6 = uv_default_loop();
    iVar4 = uv_spawn(puVar6,&process,&options);
    local_218.base = (char *)(long)iVar4;
    if ((char *)(long)iVar4 != (char *)0x0) goto LAB_001bc193;
    puVar6 = uv_default_loop();
    iVar4 = uv_run(puVar6,UV_RUN_DEFAULT);
    local_218.base = (char *)(long)iVar4;
    if ((char *)(long)iVar4 != (char *)0x0) goto LAB_001bc1a2;
    local_218.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc1b1;
    local_218.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc1c0;
    local_218 = uv_buf_init(output,0x400);
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&local_1d8,uVar5,&local_218,1,0,(uv_fs_cb)0x0);
    if (iVar4 != 0x1b) goto LAB_001bc1cf;
    unaff_R14 = (uv_process_options_t *)&local_1d8;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar4 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar5,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_001bc1de;
    uv_fs_req_cleanup(&local_1d8);
    pcVar9 = output;
    printf("output is: %s",output);
    iVar4 = strcmp("hello world\nhello errworld\n",output);
    if (iVar4 != 0) goto LAB_001bc1ed;
    unlink("stdout_file");
    pcVar9 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar9,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar9,UV_RUN_DEFAULT);
    puVar6 = uv_default_loop();
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001bc184:
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_001bc193:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001bc1a2:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001bc1b1:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001bc1c0:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001bc1cf:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001bc1de:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
LAB_001bc1ed:
    run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_9();
  loop = "stdout_file";
  puStackY_488 = (uv__queue *)0x1bc227;
  puStack_258 = (uv_loop_t *)pcVar9;
  puStack_250 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  puStackY_488 = (uv__queue *)0x1bc233;
  unlink("stderr_file");
  puStackY_488 = (uv__queue *)0x1bc246;
  init_process_options("spawn_helper6",exit_cb);
  puStackY_488 = (uv__queue *)0x1bc263;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&uStack_418,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar5 = (uint)uStack_418.result;
  uStack_450.__align = (long)iVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_460.len;
  uStack_460 = (uv_buf_t)(auVar3 << 0x40);
  if (uStack_450.__align == 0) {
    loop = (char *)(ulong)(uint)uStack_418.result;
    puStackY_488 = (uv__queue *)0x1bc290;
    uv_fs_req_cleanup(&uStack_418);
    puStackY_488 = (uv__queue *)0x1bc29c;
    uVar5 = dup2(uVar5,1);
    unaff_RBP = (uv__queue *)(ulong)uVar5;
    uStack_450.__align = (long)(int)uVar5;
    uStack_460.base = (char *)0xffffffffffffffff;
    if (uStack_450.__align == -1) goto LAB_001bc66f;
    puStackY_488 = (uv__queue *)0x1bc2df;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&uStack_418,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    uStack_450.__align = (long)iVar4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_460.len;
    uStack_460 = (uv_buf_t)(auVar1 << 0x40);
    if (uStack_450.__align != 0) goto LAB_001bc67e;
    puStackY_488 = (uv__queue *)0x1bc30c;
    uv_fs_req_cleanup(&uStack_418);
    unaff_R15 = (uv__queue *)0x2;
    puStackY_488 = (uv__queue *)0x1bc31e;
    file = dup2((uint)uStack_418.result,2);
    loop = (char *)(ulong)file;
    uStack_450.__align = (long)(int)file;
    uStack_460.base = (char *)0xffffffffffffffff;
    if (uStack_450.__align == -1) goto LAB_001bc68d;
    options.stdio = (uv_stdio_container_t *)&uStack_450;
    unaff_R14 = &options;
    uStack_450.__data.__writers = (int)file >> 0x1f;
    uStack_450.__align = (ulong)uStack_450.__data.__writers << 0x20;
    uStack_450.__data.__pad3 = 2;
    uStack_450._32_4_ = 2;
    options.stdio_count = 3;
    puStackY_488 = (uv__queue *)0x1bc376;
    uStack_450.__data.__cur_writer = file;
    uStack_450.__data.__pad2._0_4_ = uVar5;
    puVar6 = uv_default_loop();
    puStackY_488 = (uv__queue *)0x1bc388;
    iVar4 = uv_spawn(puVar6,&process,&options);
    uStack_460.base = (char *)(long)iVar4;
    if ((char *)(long)iVar4 != (char *)0x0) goto LAB_001bc69c;
    puStackY_488 = (uv__queue *)0x1bc3ad;
    puVar6 = uv_default_loop();
    puStackY_488 = (uv__queue *)0x1bc3b7;
    iVar4 = uv_run(puVar6,UV_RUN_DEFAULT);
    uStack_460.base = (char *)(long)iVar4;
    if ((char *)(long)iVar4 != (char *)0x0) goto LAB_001bc6ab;
    uStack_460.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc6ba;
    uStack_460.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc6c9;
    puStackY_488 = (uv__queue *)0x1bc432;
    uStack_460 = uv_buf_init(output,0x400);
    puStackY_488 = (uv__queue *)0x1bc45d;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&uStack_418,uVar5,&uStack_460,1,0,(uv_fs_cb)0x0);
    pcVar9 = (char *)unaff_R14;
    if (iVar4 < 0xf) goto LAB_001bc6d8;
    pcVar9 = (char *)&uStack_418;
    puStackY_488 = (uv__queue *)0x1bc48a;
    uv_fs_req_cleanup((uv_fs_t *)pcVar9);
    puStackY_488 = (uv__queue *)0x1bc498;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)pcVar9,uVar5,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_001bc6e7;
    puStackY_488 = (uv__queue *)0x1bc4c2;
    uv_fs_req_cleanup(&uStack_418);
    pcVar9 = output;
    puStackY_488 = (uv__queue *)0x1bc4da;
    printf("output is: %s",output);
    puStackY_488 = (uv__queue *)0x1bc4ee;
    iVar4 = strncmp("hello errworld\n",output,0xf);
    if (iVar4 != 0) goto LAB_001bc6f6;
    puStackY_488 = (uv__queue *)0x1bc532;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&uStack_418,file,&uStack_460,1,0,(uv_fs_cb)0x0);
    if (iVar4 < 0xc) goto LAB_001bc705;
    pcVar9 = (char *)&uStack_418;
    puStackY_488 = (uv__queue *)0x1bc55f;
    uv_fs_req_cleanup((uv_fs_t *)pcVar9);
    puStackY_488 = (uv__queue *)0x1bc56d;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)pcVar9,file,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_001bc714;
    puStackY_488 = (uv__queue *)0x1bc597;
    uv_fs_req_cleanup(&uStack_418);
    loop = output;
    puStackY_488 = (uv__queue *)0x1bc5af;
    printf("output is: %s",output);
    puStackY_488 = (uv__queue *)0x1bc5c3;
    iVar4 = strncmp("hello world\n",output,0xc);
    if (iVar4 != 0) goto LAB_001bc723;
    puStackY_488 = (uv__queue *)0x1bc5ef;
    unlink("stdout_file");
    puStackY_488 = (uv__queue *)0x1bc5fb;
    unlink("stderr_file");
    puStackY_488 = (uv__queue *)0x1bc600;
    loop = (char *)uv_default_loop();
    puStackY_488 = (uv__queue *)0x1bc614;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStackY_488 = (uv__queue *)0x1bc61e;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStackY_488 = (uv__queue *)0x1bc62c;
    puVar6 = uv_default_loop();
    puStackY_488 = (uv__queue *)0x1bc634;
    iVar4 = uv_loop_close(puVar6);
    if (iVar4 == 0) {
      puStackY_488 = (uv__queue *)0x1bc650;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_488 = (uv__queue *)0x1bc66f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bc66f:
    puStackY_488 = (uv__queue *)0x1bc67e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bc67e:
    puStackY_488 = (uv__queue *)0x1bc68d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bc68d:
    puStackY_488 = (uv__queue *)0x1bc69c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bc69c:
    puStackY_488 = (uv__queue *)0x1bc6ab;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bc6ab:
    puStackY_488 = (uv__queue *)0x1bc6ba;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bc6ba:
    puStackY_488 = (uv__queue *)0x1bc6c9;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bc6c9:
    puStackY_488 = (uv__queue *)0x1bc6d8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    pcVar9 = (char *)unaff_R14;
LAB_001bc6d8:
    puStackY_488 = (uv__queue *)0x1bc6e7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bc6e7:
    puStackY_488 = (uv__queue *)0x1bc6f6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bc6f6:
    puStackY_488 = (uv__queue *)0x1bc705;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bc705:
    puStackY_488 = (uv__queue *)0x1bc714;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bc714:
    puStackY_488 = (uv__queue *)0x1bc723;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bc723:
    puStackY_488 = (uv__queue *)0x1bc732;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  puStackY_488 = (uv__queue *)run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar10 = (int)auStackY_8b0 + 0x118;
  builtin_strncpy(acStackY_778,"hello-from-spawn_stdin",0x17);
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc77b;
  puStackY_498 = (uv_loop_t *)loop;
  puStackY_490 = (uv_fs_t *)pcVar9;
  puStackY_488 = unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc780;
  puVar7 = uv_default_loop();
  puVar6 = (uv_loop_t *)&uStackY_580;
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc795;
  uv_pipe_init(puVar7,(uv_pipe_t *)puVar6,0);
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc79a;
  puVar7 = uv_default_loop();
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc7af;
  uv_pipe_init(puVar7,(uv_pipe_t *)&uStackY_668,0);
  options.stdio = &uStackY_758;
  uStackY_758.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStackY_748 = 0x21;
  options.stdio_count = 2;
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc7e6;
  uStackY_758.data.stream = &uStackY_668;
  puStackY_740 = puVar6;
  puVar7 = uv_default_loop();
  auStackY_8b0._272_8_ = (uv_async_cb)0x1bc7f8;
  iVar4 = uv_spawn(puVar7,&process,&options);
  uStackY_730.data = (void *)(long)iVar4;
  auStackY_788._0_8_ = (char *)0x0;
  if ((uv__queue *)uStackY_730.data == (uv__queue *)0x0) {
    auStackY_788._0_8_ = acStackY_778;
    auStackY_788._8_8_ = 0x17;
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc84b;
    iVar4 = uv_write(&uStackY_730,&uStackY_668,(uv_buf_t *)auStackY_788,1,write_cb);
    auStackY_8b0._288_8_ = SEXT48(iVar4);
    auStackY_8b0._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_8b0._288_8_ != (uv__queue *)0x0) goto LAB_001bc9b1;
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc884;
    iVar4 = uv_read_start(&uStackY_580,on_alloc,on_read);
    auStackY_8b0._288_8_ = SEXT48(iVar4);
    auStackY_8b0._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_8b0._288_8_ != (uv__queue *)0x0) goto LAB_001bc9be;
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc8a7;
    puVar7 = uv_default_loop();
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc8b1;
    iVar4 = uv_run(puVar7,UV_RUN_DEFAULT);
    auStackY_8b0._288_8_ = SEXT48(iVar4);
    auStackY_8b0._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_8b0._288_8_ != (uv__queue *)0x0) goto LAB_001bc9cb;
    auStackY_8b0._288_8_ = (uv__queue *)0x1;
    auStackY_8b0._280_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_8b0._280_8_ != (uv__queue *)0x1) goto LAB_001bc9d8;
    auStackY_8b0._288_8_ = (uv__queue *)0x3;
    auStackY_8b0._280_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_8b0._280_8_ != (uv__queue *)0x3) goto LAB_001bc9e5;
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc926;
    iVar4 = strcmp(acStackY_778,output);
    auStackY_8b0._288_8_ = SEXT48(iVar4);
    auStackY_8b0._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_8b0._288_8_ != (uv__queue *)0x0) goto LAB_001bc9f2;
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc949;
    puVar6 = uv_default_loop();
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc95d;
    uv_walk(puVar6,close_walk_cb,(void *)0x0);
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc967;
    uv_run(puVar6,UV_RUN_DEFAULT);
    auStackY_8b0._288_8_ = (uv__queue *)0x0;
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc975;
    puVar7 = uv_default_loop();
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc97d;
    iVar4 = uv_loop_close(puVar7);
    auStackY_8b0._280_8_ = SEXT48(iVar4);
    if (auStackY_8b0._288_8_ == auStackY_8b0._280_8_) {
      auStackY_8b0._272_8_ = (uv_async_cb)0x1bc993;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9b1;
    run_test_spawn_stdin_cold_1();
LAB_001bc9b1:
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9be;
    run_test_spawn_stdin_cold_2();
LAB_001bc9be:
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9cb;
    run_test_spawn_stdin_cold_3();
LAB_001bc9cb:
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9d8;
    run_test_spawn_stdin_cold_4();
LAB_001bc9d8:
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9e5;
    run_test_spawn_stdin_cold_5();
LAB_001bc9e5:
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9f2;
    run_test_spawn_stdin_cold_6();
LAB_001bc9f2:
    auStackY_8b0._272_8_ = (uv_async_cb)0x1bc9ff;
    run_test_spawn_stdin_cold_7();
  }
  puVar11 = auStackY_8b0 + 0x120;
  auStackY_8b0._272_8_ = write_cb;
  run_test_spawn_stdin_cold_8();
  auStackY_8b0._272_8_ = SEXT48(iVar10);
  auStackY_8b0._264_8_ = 0;
  if ((uv_async_cb)auStackY_8b0._272_8_ == (uv_async_cb)0x0) {
    uv_close(*(uv_handle_t **)(puVar11 + 0x58),close_cb);
    return extraout_EAX;
  }
  auStackY_8b0._248_8_ = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_9e0.queued_fds = (void *)0x1bca6e;
  auStackY_8b0._232_8_ = puVar6;
  auStackY_8b0._240_8_ = &uStackY_668;
  auStackY_8b0._248_8_ = unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_9e0.queued_fds = (void *)0x1bca73;
  puVar6 = uv_default_loop();
  puVar8 = (uv_process_options_t *)auStackY_8b0;
  uStackY_9e0.queued_fds = (void *)0x1bca87;
  uv_pipe_init(puVar6,(uv_pipe_t *)puVar8,0);
  options.stdio = &uStackY_8f8;
  uStackY_8f8.flags = UV_IGNORE;
  uStackY_8e8 = 0;
  uStackY_8d8 = 0;
  uStackY_8c8 = 0x21;
  options.stdio_count = 4;
  uStackY_9e0.queued_fds = (void *)0x1bcabc;
  puStackY_8c0 = (uv_loop_t *)puVar8;
  puVar6 = uv_default_loop();
  uStackY_9e0.queued_fds = (void *)0x1bcace;
  iVar4 = uv_spawn(puVar6,&process,&options);
  lStackY_900 = (long)iVar4;
  lStackY_908 = 0;
  if (lStackY_900 == 0) {
    uStackY_9e0.queued_fds = (void *)0x1bcb04;
    iVar4 = uv_read_start((uv_stream_t *)auStackY_8b0,on_alloc,on_read);
    lStackY_900 = (long)iVar4;
    lStackY_908 = 0;
    if (lStackY_900 != 0) goto LAB_001bcc44;
    uStackY_9e0.queued_fds = (void *)0x1bcb27;
    puVar6 = uv_default_loop();
    uStackY_9e0.queued_fds = (void *)0x1bcb31;
    iVar4 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStackY_900 = (long)iVar4;
    lStackY_908 = 0;
    if (lStackY_900 != 0) goto LAB_001bcc51;
    lStackY_900 = 1;
    lStackY_908 = (long)exit_cb_called;
    if (lStackY_908 != 1) goto LAB_001bcc5e;
    lStackY_900 = 2;
    lStackY_908 = (long)close_cb_called;
    if (lStackY_908 != 2) goto LAB_001bcc6b;
    uStackY_9e0.queued_fds = (void *)0x1bcbad;
    printf("output from stdio[3] is: %s",output);
    uStackY_9e0.queued_fds = (void *)0x1bcbbc;
    iVar4 = strcmp("fourth stdio!\n",output);
    lStackY_900 = (long)iVar4;
    lStackY_908 = 0;
    puVar8 = (uv_process_options_t *)output;
    if (lStackY_900 != 0) goto LAB_001bcc78;
    uStackY_9e0.queued_fds = (void *)0x1bcbdf;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    uStackY_9e0.queued_fds = (void *)0x1bcbf3;
    uv_walk((uv_loop_t *)puVar8,close_walk_cb,(void *)0x0);
    uStackY_9e0.queued_fds = (void *)0x1bcbfd;
    uv_run((uv_loop_t *)puVar8,UV_RUN_DEFAULT);
    lStackY_900 = 0;
    uStackY_9e0.queued_fds = (void *)0x1bcc0b;
    puVar6 = uv_default_loop();
    uStackY_9e0.queued_fds = (void *)0x1bcc13;
    iVar4 = uv_loop_close(puVar6);
    lStackY_908 = (long)iVar4;
    if (lStackY_900 == lStackY_908) {
      uStackY_9e0.queued_fds = (void *)0x1bcc29;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStackY_9e0.queued_fds = (void *)0x1bcc44;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001bcc44:
    uStackY_9e0.queued_fds = (void *)0x1bcc51;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001bcc51:
    uStackY_9e0.queued_fds = (void *)0x1bcc5e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001bcc5e:
    uStackY_9e0.queued_fds = (void *)0x1bcc6b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001bcc6b:
    uStackY_9e0.queued_fds = (void *)0x1bcc78;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001bcc78:
    uStackY_9e0.queued_fds = (void *)0x1bcc85;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_9e0.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_9f8 = (uv_loop_t *)0x1bcc9e;
  puVar6 = uv_default_loop();
  puStackY_9f8 = (uv_loop_t *)0x1bccab;
  iVar4 = uv_tcp_init(puVar6,&uStackY_9e0);
  lStackY_9e8 = (long)iVar4;
  uStackY_9f0 = 0;
  if (lStackY_9e8 == 0) {
    puStackY_9f8 = (uv_loop_t *)0x1bccd4;
    iVar4 = uv_tcp_open(&uStackY_9e0,3);
    lStackY_9e8 = (long)iVar4;
    uStackY_9f0 = 0;
    if (lStackY_9e8 != 0) goto LAB_001bcd33;
    puStackY_9f8 = (uv_loop_t *)0x1bccff;
    iVar4 = uv_listen((uv_stream_t *)&uStackY_9e0,0x1000,(uv_connection_cb)0x0);
    lStackY_9e8 = (long)iVar4;
    uStackY_9f0 = 0;
    if (lStackY_9e8 == 0) {
      return 1;
    }
  }
  else {
    puStackY_9f8 = (uv_loop_t *)0x1bcd33;
    spawn_tcp_server_helper_cold_1();
LAB_001bcd33:
    puStackY_9f8 = (uv_loop_t *)0x1bcd40;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_9f8 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_a70 = (uv_process_options_t *)0x1bcd65;
  puStackY_9f8 = (uv_loop_t *)puVar8;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStackY_a70 = (uv_process_options_t *)0x1bcd7b;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_a08);
  uStackY_a48._0_8_ = SEXT48(iVar4);
  lStackY_a60 = 0;
  if (uStackY_a48._0_8_ == 0) {
    puStackY_a70 = (uv_process_options_t *)0x1bcda0;
    puVar6 = uv_default_loop();
    puStackY_a70 = (uv_process_options_t *)0x1bcdb4;
    iVar4 = uv_tcp_init_ex(puVar6,&tcp_server,2);
    uStackY_a48._0_8_ = SEXT48(iVar4);
    lStackY_a60 = 0;
    if (uStackY_a48._0_8_ != 0) goto LAB_001bcf99;
    puStackY_a70 = (uv_process_options_t *)0x1bcde7;
    iVar4 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_a08,0);
    uStackY_a48._0_8_ = SEXT48(iVar4);
    lStackY_a60 = 0;
    if (uStackY_a48._0_8_ != 0) goto LAB_001bcfa8;
    puStackY_a70 = (uv_process_options_t *)0x1bce18;
    iVar4 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_a4c);
    uStackY_a48._0_8_ = SEXT48(iVar4);
    lStackY_a60 = 0;
    if (uStackY_a48._0_8_ != 0) goto LAB_001bcfb7;
    options.stdio = &uStackY_a48;
    puVar8 = &options;
    uStackY_a48._4_4_ = iVar4 >> 0x1f;
    uStackY_a48.flags = 2;
    uStackY_a48.data.file = 0;
    uStackY_a38 = 2;
    uStackY_a30 = 1;
    uStackY_a28 = 2;
    uStackY_a20 = 2;
    uStackY_a18 = 2;
    uStackY_a10 = uStackY_a4c;
    options.stdio_count = 4;
    puStackY_a70 = (uv_process_options_t *)0x1bce82;
    puVar6 = uv_default_loop();
    puStackY_a70 = (uv_process_options_t *)0x1bce94;
    iVar4 = uv_spawn(puVar6,&process,&options);
    lStackY_a60 = (long)iVar4;
    lStackY_a58 = 0;
    if (lStackY_a60 != 0) goto LAB_001bcfc6;
    puStackY_a70 = (uv_process_options_t *)0x1bceb9;
    puVar6 = uv_default_loop();
    puStackY_a70 = (uv_process_options_t *)0x1bcec3;
    iVar4 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStackY_a60 = (long)iVar4;
    lStackY_a58 = 0;
    if (lStackY_a60 != 0) goto LAB_001bcfd5;
    lStackY_a60 = 1;
    lStackY_a58 = (long)exit_cb_called;
    if (lStackY_a58 != 1) goto LAB_001bcfe4;
    lStackY_a60 = 1;
    lStackY_a58 = (long)close_cb_called;
    if (lStackY_a58 != 1) goto LAB_001bcff3;
    puStackY_a70 = (uv_process_options_t *)0x1bcf32;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    puStackY_a70 = (uv_process_options_t *)0x1bcf46;
    uv_walk((uv_loop_t *)puVar8,close_walk_cb,(void *)0x0);
    puStackY_a70 = (uv_process_options_t *)0x1bcf50;
    uv_run((uv_loop_t *)puVar8,UV_RUN_DEFAULT);
    lStackY_a60 = 0;
    puStackY_a70 = (uv_process_options_t *)0x1bcf5e;
    puVar6 = uv_default_loop();
    puStackY_a70 = (uv_process_options_t *)0x1bcf66;
    iVar4 = uv_loop_close(puVar6);
    lStackY_a58 = (long)iVar4;
    if (lStackY_a60 == lStackY_a58) {
      puStackY_a70 = (uv_process_options_t *)0x1bcf82;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_a70 = (uv_process_options_t *)0x1bcf99;
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf99:
    puStackY_a70 = (uv_process_options_t *)0x1bcfa8;
    run_test_spawn_tcp_server_cold_2();
LAB_001bcfa8:
    puStackY_a70 = (uv_process_options_t *)0x1bcfb7;
    run_test_spawn_tcp_server_cold_3();
LAB_001bcfb7:
    puStackY_a70 = (uv_process_options_t *)0x1bcfc6;
    run_test_spawn_tcp_server_cold_4();
LAB_001bcfc6:
    puStackY_a70 = (uv_process_options_t *)0x1bcfd5;
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfd5:
    puStackY_a70 = (uv_process_options_t *)0x1bcfe4;
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfe4:
    puStackY_a70 = (uv_process_options_t *)0x1bcff3;
    run_test_spawn_tcp_server_cold_7();
LAB_001bcff3:
    puStackY_a70 = (uv_process_options_t *)0x1bd002;
    run_test_spawn_tcp_server_cold_8();
  }
  puStackY_a70 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStackY_a70 = &options;
  puStackY_a98 = (uv_loop_t *)0x1bd02b;
  puStackY_a78 = (uv_loop_t *)puVar8;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar8 = &options;
  options.stdio_count = 0;
  puStackY_a98 = (uv_loop_t *)0x1bd04b;
  puVar6 = uv_default_loop();
  puStackY_a98 = (uv_loop_t *)0x1bd05d;
  iVar4 = uv_spawn(puVar6,&process,&options);
  lStackY_a80 = (long)iVar4;
  lStackY_a88 = 0;
  if (lStackY_a80 == 0) {
    puStackY_a98 = (uv_loop_t *)0x1bd07e;
    puVar6 = uv_default_loop();
    puStackY_a98 = (uv_loop_t *)0x1bd088;
    iVar4 = uv_run(puVar6,UV_RUN_DEFAULT);
    lStackY_a80 = (long)iVar4;
    lStackY_a88 = 0;
    if (lStackY_a80 != 0) goto LAB_001bd15c;
    lStackY_a80 = 1;
    lStackY_a88 = (long)exit_cb_called;
    if (lStackY_a88 != 1) goto LAB_001bd16b;
    lStackY_a80 = 1;
    lStackY_a88 = (long)close_cb_called;
    if (lStackY_a88 != 1) goto LAB_001bd17a;
    puStackY_a98 = (uv_loop_t *)0x1bd0f7;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    puStackY_a98 = (uv_loop_t *)0x1bd10b;
    uv_walk((uv_loop_t *)puVar8,close_walk_cb,(void *)0x0);
    puStackY_a98 = (uv_loop_t *)0x1bd115;
    uv_run((uv_loop_t *)puVar8,UV_RUN_DEFAULT);
    lStackY_a80 = 0;
    puStackY_a98 = (uv_loop_t *)0x1bd123;
    puVar6 = uv_default_loop();
    puStackY_a98 = (uv_loop_t *)0x1bd12b;
    iVar4 = uv_loop_close(puVar6);
    lStackY_a88 = (long)iVar4;
    if (lStackY_a80 == lStackY_a88) {
      puStackY_a98 = (uv_loop_t *)0x1bd143;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_a98 = (uv_loop_t *)0x1bd15c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd15c:
    puStackY_a98 = (uv_loop_t *)0x1bd16b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd16b:
    puStackY_a98 = (uv_loop_t *)0x1bd17a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd17a:
    puStackY_a98 = (uv_loop_t *)0x1bd189;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStackY_a98 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  puVar11 = auStackY_ac8 + 0x20;
  auStackY_ac8._24_8_ = (uv_close_cb)0x1bd1b0;
  puStackY_a98 = (uv_loop_t *)puVar8;
  init_process_options("spawn_helper4",kill_cb);
  auStackY_ac8._24_8_ = (uv_close_cb)0x1bd1b5;
  puVar6 = uv_default_loop();
  auStackY_ac8._24_8_ = (uv_close_cb)0x1bd1cb;
  iVar4 = uv_spawn(puVar6,&process,&options);
  auStackY_ac8._40_8_ = SEXT48(iVar4);
  auStackY_ac8._32_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStackY_ac8._40_8_ == (uv__queue *)0x0) {
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd1ee;
    puVar6 = uv_default_loop();
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd1fd;
    iVar4 = uv_timer_init(puVar6,&timer);
    auStackY_ac8._40_8_ = SEXT48(iVar4);
    auStackY_ac8._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_ac8._40_8_ != (uv__queue *)0x0) goto LAB_001bd32a;
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd235;
    iVar4 = uv_timer_start(&timer,timer_cb,500,0);
    auStackY_ac8._40_8_ = SEXT48(iVar4);
    auStackY_ac8._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_ac8._40_8_ != (uv__queue *)0x0) goto LAB_001bd337;
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd258;
    puVar6 = uv_default_loop();
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd262;
    iVar4 = uv_run(puVar6,UV_RUN_DEFAULT);
    auStackY_ac8._40_8_ = SEXT48(iVar4);
    auStackY_ac8._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_ac8._40_8_ != (uv__queue *)0x0) goto LAB_001bd344;
    auStackY_ac8._40_8_ = (uv__queue *)0x1;
    auStackY_ac8._32_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_ac8._32_8_ != (uv__queue *)0x1) goto LAB_001bd351;
    auStackY_ac8._40_8_ = (uv__queue *)0x2;
    auStackY_ac8._32_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_ac8._32_8_ != (uv__queue *)0x2) goto LAB_001bd35e;
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd2cb;
    puVar8 = (uv_process_options_t *)uv_default_loop();
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd2df;
    uv_walk((uv_loop_t *)puVar8,close_walk_cb,(void *)0x0);
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd2e9;
    uv_run((uv_loop_t *)puVar8,UV_RUN_DEFAULT);
    auStackY_ac8._40_8_ = (uv__queue *)0x0;
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd2f7;
    puVar6 = uv_default_loop();
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd2ff;
    iVar4 = uv_loop_close(puVar6);
    auStackY_ac8._32_8_ = SEXT48(iVar4);
    if (auStackY_ac8._40_8_ == auStackY_ac8._32_8_) {
      auStackY_ac8._24_8_ = (uv_close_cb)0x1bd315;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd32a;
    run_test_spawn_and_kill_cold_1();
LAB_001bd32a:
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd337;
    run_test_spawn_and_kill_cold_2();
LAB_001bd337:
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd344;
    run_test_spawn_and_kill_cold_3();
LAB_001bd344:
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd351;
    run_test_spawn_and_kill_cold_4();
LAB_001bd351:
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd35e;
    run_test_spawn_and_kill_cold_5();
LAB_001bd35e:
    auStackY_ac8._24_8_ = (uv_close_cb)0x1bd36b;
    run_test_spawn_and_kill_cold_6();
  }
  puVar12 = (uv_handle_t *)(auStackY_ac8 + 0x28);
  auStackY_ac8._24_8_ = kill_cb;
  run_test_spawn_and_kill_cold_7();
  auStackY_ac8._24_8_ = (uv_close_cb)0x0;
  auStackY_ac8._16_8_ = 0;
  auStackY_ac8._8_8_ = puVar8;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  auStackY_ac8._0_8_ = puVar11;
  if (puVar11 == (undefined1 *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd419;
    uv_close(puVar12,close_cb);
    auStackY_ac8._0_8_ = SEXT48(*(int *)&puVar12[1].loop);
    if ((undefined1 *)auStackY_ac8._0_8_ != (undefined1 *)0x0) {
      iVar4 = uv_kill(*(int *)&puVar12[1].loop,0);
      auStackY_ac8._0_8_ = SEXT48(iVar4);
      if ((undefined1 *)auStackY_ac8._0_8_ == (undefined1 *)0xfffffffffffffffd) {
        return iVar4;
      }
      goto LAB_001bd42b;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd419:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd42b:
  puVar12 = (uv_handle_t *)auStackY_ac8;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar12,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file2) {
#ifndef _WIN32
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper6", exit_cb);

  /* Replace stderr with our file */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  file = dup2(file, STDERR_FILENO);
  ASSERT_NE(file, -1);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(27, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\nhello errworld\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}